

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rc_model_v2.c
# Opt level: O2

RK_S32 moving_judge_update(RcModelV2Ctx *ctx,EncRcTaskInfo *cfg)

{
  long lVar1;
  long lVar2;
  long lVar3;
  
  if (cfg->frame_type == INTRA_FRAME) {
    lVar3 = 0x24;
    lVar2 = 400;
    lVar1 = 0x180;
  }
  else {
    if (cfg->frame_type != INTER_P_FRAME) {
      return 0;
    }
    lVar3 = 0x2c;
    lVar2 = 0x1a0;
    lVar1 = 0x178;
  }
  mpp_data_update_v2(*(MppDataV2 **)((long)(ctx->usr_cfg).layer_bit_prop + lVar1 + -0x4c),
                     cfg->bit_real);
  mpp_data_update_v2(*(MppDataV2 **)((long)(ctx->usr_cfg).layer_bit_prop + lVar2 + -0x4c),
                     *(RK_S32 *)((long)cfg->reserve + lVar3 + -0x78));
  return 0;
}

Assistant:

RK_S32 moving_judge_update(RcModelV2Ctx *ctx, EncRcTaskInfo *cfg)
{
    switch (cfg->frame_type) {
    case INTRA_FRAME: {
        mpp_data_update_v2(ctx->pre_i_bit, cfg->bit_real);
        mpp_data_update_v2(ctx->pre_i_mean_qp, cfg->quality_real);
    } break;

    case INTER_P_FRAME: {
        mpp_data_update_v2(ctx->pre_p_bit, cfg->bit_real);
        mpp_data_update_v2(ctx->madp, cfg->madp);
    } break;

    default:
        break;
    }
    return 0;
}